

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_WriteSysEx(PortMidiStream *stream,PmTimestamp when,uchar *msg)

{
  undefined1 uVar1;
  uint uVar2;
  long lVar3;
  PmEvent PVar4;
  PmError PVar5;
  PmError err_2;
  PmError err_1;
  PmError err;
  int bufx;
  int shift;
  PmInternal *midi;
  PmMessage local_828;
  int buffer_size;
  PmEvent buffer [256];
  uchar *msg_local;
  PmTimestamp when_local;
  PortMidiStream *stream_local;
  
  buffer[0xff] = (PmEvent)msg;
  midi._4_4_ = pmGotData;
  err = pmNoData;
  err_1 = pmNoData;
  local_828 = 0;
  buffer_size = when;
  do {
    do {
      *(uint *)((long)&stack0xfffffffffffff7d8 + (long)err_1 * 8) =
           (uint)*(byte *)buffer[0xff] << ((byte)err & 0x1f) |
           *(uint *)((long)&stack0xfffffffffffff7d8 + (long)err_1 * 8);
      PVar4 = buffer[0xff];
      err = err + 8;
      buffer[0xff] = (PmEvent)((long)buffer[0xff] + 1);
      if (*(char *)PVar4 == -9) {
LAB_00104c3a:
        if (err != pmNoData) {
          err_1 = err_1 + pmGotData;
        }
        if ((err_1 == pmNoData) ||
           (stream_local._4_4_ = Pm_Write(stream,(PmEvent *)&stack0xfffffffffffff7d8,err_1),
           stream_local._4_4_ == pmNoData)) {
          stream_local._4_4_ = pmNoData;
        }
        return stream_local._4_4_;
      }
    } while (err != 0x20);
    err = pmNoData;
    err_1 = err_1 + pmGotData;
    if (err_1 == midi._4_4_) {
      PVar5 = Pm_Write(stream,(PmEvent *)&stack0xfffffffffffff7d8,midi._4_4_);
      if (PVar5 != pmNoData) {
        return PVar5;
      }
      err_1 = pmNoData;
      midi._4_4_ = 0x100;
      if (*(long *)((long)stream + 0x60) != 0) {
        while (PVar4 = buffer[0xff],
              **(uint **)((long)stream + 0x68) < *(uint *)((long)stream + 0x70)) {
          uVar1 = *(undefined1 *)buffer[0xff];
          lVar3 = *(long *)((long)stream + 0x60);
          uVar2 = **(uint **)((long)stream + 0x68);
          **(uint **)((long)stream + 0x68) = uVar2 + 1;
          *(undefined1 *)(lVar3 + (ulong)uVar2) = uVar1;
          buffer[0xff] = (PmEvent)((long)buffer[0xff] + 1);
          if (*(char *)PVar4 == -9) {
            PVar5 = pm_end_sysex((PmInternal *)stream);
            if (PVar5 != pmNoData) {
              return PVar5;
            }
            goto LAB_00104c3a;
          }
        }
        midi._4_4_ = pmGotData;
      }
    }
    *(undefined4 *)((long)&stack0xfffffffffffff7d8 + (long)err_1 * 8) = 0;
    buffer[(long)err_1 + -1].timestamp = when;
  } while( true );
}

Assistant:

PMEXPORT PmError Pm_WriteSysEx(PortMidiStream *stream, PmTimestamp when, 
                      unsigned char *msg)
{
    /* allocate buffer space for PM_DEFAULT_SYSEX_BUFFER_SIZE bytes */
    /* each PmEvent holds sizeof(PmMessage) bytes of sysex data */
    #define BUFLEN ((int) (PM_DEFAULT_SYSEX_BUFFER_SIZE / sizeof(PmMessage)))
    PmEvent buffer[BUFLEN];
    int buffer_size = 1; /* first time, send 1. After that, it's BUFLEN */
    PmInternal *midi = (PmInternal *) stream;
    /* the next byte in the buffer is represented by an index, bufx, and
       a shift in bits */
    int shift = 0;
    int bufx = 0;
    buffer[0].message = 0;
    buffer[0].timestamp = when;

    while (1) {
        /* insert next byte into buffer */
        buffer[bufx].message |= ((*msg) << shift);
        shift += 8;
        if (*msg++ == MIDI_EOX) break;
        if (shift == 32) {
            shift = 0;
            bufx++;
            if (bufx == buffer_size) {
                PmError err = Pm_Write(stream, buffer, buffer_size);
                /* note: Pm_Write has already called errmsg() */
                if (err) return err;
                /* prepare to fill another buffer */
                bufx = 0;
                buffer_size = BUFLEN;
                /* optimization: maybe we can just copy bytes */
                if (midi->fill_base) {
                    PmError err;
                    while (*(midi->fill_offset_ptr) < midi->fill_length) {
                        midi->fill_base[(*midi->fill_offset_ptr)++] = *msg;
                        if (*msg++ == MIDI_EOX) {
                            err = pm_end_sysex(midi);
                            if (err != pmNoError) return pm_errmsg(err);
                            goto end_of_sysex;
                        }
                    }
                    /* I thought that I could do a pm_Write here and
                     * change this if to a loop, avoiding calls in Pm_Write
                     * to the slower write_byte, but since 
                     * sysex_in_progress is true, this will not flush
                     * the buffer, and we'll infinite loop: */
                    /* err = Pm_Write(stream, buffer, 0);
                       if (err) return err; */
                    /* instead, the way this works is that Pm_Write calls
                     * write_byte on 4 bytes. The first, since the buffer
                     * is full, will flush the buffer and allocate a new
                     * one. This primes the buffer so
                     * that we can return to the loop above and fill it
                     * efficiently without a lot of function calls.
                     */
                    buffer_size = 1; /* get another message started */
                }
            }
            buffer[bufx].message = 0;
            buffer[bufx].timestamp = when;
        } 
        /* keep inserting bytes until you find MIDI_EOX */
    }
end_of_sysex:
    /* we're finished sending full buffers, but there may
     * be a partial one left.
     */
    if (shift != 0) bufx++; /* add partial message to buffer len */
    if (bufx) { /* bufx is number of PmEvents to send from buffer */
        PmError err = Pm_Write(stream, buffer, bufx);
        if (err) return err;
    }
    return pmNoError;
}